

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O0

nh_bool set_command_keys(win_menu *mdat,wchar_t idx)

{
  int local_38;
  int local_34;
  wchar_t count;
  wchar_t i;
  nh_cmd_desc *cmdlist;
  nh_cmd_desc *cmd;
  wchar_t id;
  wchar_t idx_local;
  win_menu *mdat_local;
  
  cmd._0_4_ = mdat->items[idx].id;
  cmd._4_4_ = idx;
  _id = mdat;
  if ((int)cmd == -10000) {
    local_38 = 0;
    init_keymap();
    _count = nh_get_commands(&local_38);
    for (local_34 = 0; local_34 < local_38; local_34 = local_34 + 1) {
      cmdlist = find_command((char *)(_count + (long)local_34 * 0x6c));
      if (cmdlist != (nh_cmd_desc *)0x0) {
        cmdlist->flags = *(uint *)(_count + (long)local_34 * 0x6c + 0x68);
      }
    }
  }
  else {
    if ((int)cmd < 0) {
      cmdlist = builtin_commands + -((int)cmd + 1);
    }
    else {
      cmdlist = commandlist + ((int)cmd + -1);
    }
    command_settings_menu(cmdlist);
  }
  return '\x01';
}

Assistant:

static nh_bool set_command_keys(struct win_menu *mdat, int idx)
{
    int id = mdat->items[idx].id;
    struct nh_cmd_desc *cmd, *cmdlist;
    
    if (id == RESET_BINDINGS_ID) {
	int i, count = 0;
	init_keymap(); /* fully reset the keymap */
	
	/* reset extcmds */
	cmdlist = nh_get_commands(&count);
	for (i = 0; i < count; i++) {
	    cmd = find_command(cmdlist[i].name);
	    if (cmd)
		cmd->flags = cmdlist[i].flags;
	}
	
	return TRUE;
    }
    
    if (id < 0)
	cmd = &builtin_commands[-(id+1)];
    else
	cmd = &commandlist[id-1];
    
    command_settings_menu(cmd);
    
    return TRUE;
}